

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall lest::transformed_abi_cxx11_(string *__return_storage_ptr__,lest *this,char chr)

{
  Tr *__s;
  char __c;
  bool bVar1;
  char c;
  allocator<char> local_85 [20];
  allocator<char> local_71;
  Tr **local_70;
  Tr *pos;
  Tr table [5];
  char chr_local;
  
  table[4].str._7_1_ = (char)this;
  memcpy(&pos,&DAT_00153bd0,0x50);
  local_70 = &pos;
  while( true ) {
    if (local_70 == (Tr **)&table[4].str) {
      bVar1 = unprintable(table[4].str._7_1_);
      __c = table[4].str._7_1_;
      if (bVar1) {
        to_hex_string_abi_cxx11_
                  (__return_storage_ptr__,(lest *)(ulong)(uint)(int)table[4].str._7_1_,c);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,1,__c,local_85);
        std::allocator<char>::~allocator(local_85);
      }
      return __return_storage_ptr__;
    }
    if (table[4].str._7_1_ == *(char *)local_70) break;
    local_70 = local_70 + 2;
  }
  __s = local_70[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,&__s->chr,&local_71);
  std::allocator<char>::~allocator(&local_71);
  return __return_storage_ptr__;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( Tr * pos = table; pos != table + lest_DIMENSION_OF( table ); ++pos )
    {
        if ( chr == pos->chr )
            return pos->str;
    }

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}